

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRAccessChain * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::allocate<spirv_cross::SPIRAccessChain&>
          (ObjectPool<spirv_cross::SPIRAccessChain> *this,SPIRAccessChain *p)

{
  Vector<spirv_cross::SPIRAccessChain_*> *this_00;
  pointer pcVar1;
  bool bVar2;
  VariableID VVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  _Tuple_impl<0UL,_spirv_cross::SPIRAccessChain_*,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
  _Var6;
  _Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false> _Var7;
  size_t sVar8;
  ulong uVar9;
  SPIRAccessChain *pSVar10;
  
  this_00 = &this->vacants;
  sVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
  if (sVar8 == 0) {
    sVar8 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
            .buffer_size;
    uVar9 = (ulong)(this->start_object_count << ((byte)sVar8 & 0x1f));
    _Var6.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>)malloc(uVar9 * 0xa8);
    if (_Var6.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl ==
        (SPIRAccessChain *)0x0) {
      return (SPIRAccessChain *)0x0;
    }
    if (uVar9 != 0) {
      sVar8 = 0;
      _Var7._M_head_impl =
           (SPIRAccessChain *)
           _Var6.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::reserve(this_00,sVar8 + 1);
        sVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.ptr[sVar8] =
             _Var7._M_head_impl;
        sVar8 = sVar8 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size = sVar8;
        _Var7._M_head_impl = _Var7._M_head_impl + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      sVar8 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar8 + 1);
    sVar8 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
    .ptr[sVar8]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRAccessChain_*,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false> =
         _Var6.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
    .buffer_size = sVar8 + 1;
    sVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
    pSVar10 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.ptr[sVar8 - 1];
    if (sVar8 == 0) goto LAB_0023c67a;
  }
  else {
    pSVar10 = (this_00->super_VectorView<spirv_cross::SPIRAccessChain_*>).ptr[sVar8 - 1];
  }
  SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::resize(this_00,sVar8 - 1);
LAB_0023c67a:
  (pSVar10->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar10->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRAccessChain_003d5360;
  *(undefined8 *)&(pSVar10->super_IVariant).field_0xc =
       *(undefined8 *)&(p->super_IVariant).field_0xc;
  (pSVar10->base)._M_dataplus._M_p = (pointer)&(pSVar10->base).field_2;
  pcVar1 = (p->base)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar10->base,pcVar1,pcVar1 + (p->base)._M_string_length);
  (pSVar10->dynamic_index)._M_dataplus._M_p = (pointer)&(pSVar10->dynamic_index).field_2;
  pcVar1 = (p->dynamic_index)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar10->dynamic_index,pcVar1,pcVar1 + (p->dynamic_index)._M_string_length);
  bVar2 = p->immutable;
  pSVar10->row_major_matrix = p->row_major_matrix;
  pSVar10->immutable = bVar2;
  VVar3.id = (p->loaded_from).id;
  uVar4 = p->matrix_stride;
  uVar5 = p->array_stride;
  pSVar10->static_index = p->static_index;
  pSVar10->loaded_from = (VariableID)VVar3.id;
  pSVar10->matrix_stride = uVar4;
  pSVar10->array_stride = uVar5;
  (pSVar10->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
  .buffer_size = 0;
  (pSVar10->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
  .ptr = (TypedID<(spirv_cross::Types)0> *)&(pSVar10->implied_read_expressions).stack_storage;
  (pSVar10->implied_read_expressions).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&pSVar10->implied_read_expressions,&p->implied_read_expressions);
  return pSVar10;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}